

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyevent.c
# Opt level: O3

void copy_cursor(int newx,int newy)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  byte bVar6;
  sbyte sVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint *puVar16;
  uint uVar17;
  uint uVar18;
  uint *puVar19;
  uint uVar20;
  uint uVar21;
  uint *puVar22;
  uint *local_60;
  uint *local_50;
  
  uVar4 = displaywidth;
  iVar3 = LastCursorClippingX;
  uVar18 = displaywidth + 0xf;
  if (-1 < (int)displaywidth) {
    uVar18 = displaywidth;
  }
  if (newx < 0) {
    uVar8 = -(ulong)(7U - newx >> 3);
  }
  else {
    uVar8 = (ulong)((uint)newx >> 3);
  }
  uVar8 = (long)DisplayRegion68k + uVar8 + (long)(((int)uVar18 >> 4) * newy) * 2;
  if (0 < LastCursorClippingY) {
    local_50 = (uint *)((ulong)EmCursorBitMap68K & 0xfffffffffffffffc);
    uVar9 = (int)EmCursorBitMap68K * 8;
    uVar18 = (newx & 7U) + ((uint)uVar8 & 3) * 8;
    iVar5 = uVar18 + (int)EmCursorBitMap68K * -8;
    uVar13 = uVar9 & 0x18;
    uVar10 = uVar9 - uVar18 & 0x1f;
    uVar20 = 0;
    uVar14 = -(uint)(uVar10 == 0) | ~(-1 << (sbyte)uVar10);
    uVar21 = (LastCursorClippingX + uVar18) - 1 & 0x1f;
    uVar12 = -1 << (~(byte)uVar21 & 0x1f);
    uVar15 = -(uint)(uVar18 == 0) | -1 << (-(char)uVar18 & 0x1fU) ^ 0xffffffffU;
    uVar11 = uVar12 & uVar15;
    local_60 = (uint *)(uVar8 & 0xfffffffffffffffc);
    iVar2 = LastCursorClippingY;
    do {
      bVar6 = (byte)iVar5 & 0x1f;
      sVar7 = (sbyte)uVar10;
      if (uVar18 < uVar13) {
        uVar17 = *local_50 << sVar7;
        if (0x20 < (int)(iVar3 + uVar13)) {
          puVar22 = local_50 + 2;
          uVar10 = local_50[1];
          uVar17 = uVar17 | uVar10 >> bVar6 & uVar14;
          goto LAB_001290f1;
        }
        puVar22 = local_50 + 1;
      }
      else {
        puVar22 = local_50 + 1;
        uVar10 = *local_50;
        uVar17 = uVar10 >> bVar6 & uVar14;
LAB_001290f1:
        uVar20 = ~uVar14 & uVar10 << sVar7;
      }
      puVar16 = local_60;
      if ((int)(iVar3 + uVar18) < 0x21) {
LAB_001291dc:
        uVar9 = *puVar16;
        *puVar16 = ((uVar17 | uVar9) ^ uVar9) & uVar11 ^ uVar9;
      }
      else {
        uVar10 = (int)(uVar18 + iVar3) >> 5;
        uVar11 = *local_60;
        *local_60 = ((uVar17 | uVar11) ^ uVar11) & uVar15 ^ uVar11;
        puVar16 = local_60 + 1;
        if (uVar13 == uVar18) {
          if (1 < (int)uVar10) {
            do {
              *puVar16 = *puVar16 | *puVar22;
              puVar22 = puVar22 + 1;
              puVar16 = puVar16 + 1;
              uVar10 = uVar10 - 1;
            } while (1 < uVar10);
          }
        }
        else {
          puVar19 = puVar16;
          uVar11 = uVar20;
          if (1 < (int)uVar10) {
            do {
              uVar15 = *puVar22;
              puVar22 = puVar22 + 1;
              uVar20 = uVar15 << sVar7;
              puVar16 = puVar19 + 1;
              *puVar19 = uVar11 | *puVar19 | uVar15 >> bVar6;
              uVar10 = uVar10 - 1;
              puVar19 = puVar16;
              uVar11 = uVar20;
            } while (1 < uVar10);
          }
        }
        if (uVar21 != 0x1f) {
          uVar11 = uVar12;
          uVar17 = uVar20;
          if (((iVar3 + uVar9) - 1 & 0x1f) <= uVar21) {
            uVar17 = *puVar22 >> bVar6 & uVar14 | uVar20;
          }
          goto LAB_001291dc;
        }
      }
      uVar10 = uVar18 + uVar4;
      local_60 = local_60 + ((int)uVar10 >> 5);
      uVar18 = uVar10 & 0x1f;
      uVar21 = (uVar18 + iVar3) - 1 & 0x1f;
      uVar15 = -(uint)(uVar18 == 0) | ~(-1 << (-(char)uVar18 & 0x1fU));
      uVar12 = -1 << (~(byte)uVar21 & 0x1f);
      uVar11 = uVar12 & uVar15;
      uVar9 = uVar13 + 0x10;
      iVar5 = uVar18 - uVar9;
      uVar10 = uVar9 - uVar10 & 0x1f;
      local_50 = local_50 + (uVar9 >> 5);
      uVar13 = uVar9 & 0x1f;
      uVar14 = -(uint)(uVar10 == 0) | ~(-1 << (sbyte)uVar10);
      bVar1 = 1 < iVar2;
      iVar2 = iVar2 + -1;
    } while (bVar1);
  }
  return;
}

Assistant:

void copy_cursor(int newx, int newy)
{
  DLword *srcbase, *dstbase;
  static int sx, dx, w, h, srcbpl, dstbpl, backwardflg = 0;
  static int src_comp = 0, op = 0, gray = 0, num_gray = 0, curr_gray_line = 0;
  extern DLword *EmCursorBitMap68K;
  /* copy cursor image */
  srcbase = EmCursorBitMap68K;
  dstbase = DisplayRegion68k + (newy * DLWORD_PERLINE);
  sx = 0;
  dx = newx;
  w = LastCursorClippingX;
  h = LastCursorClippingY;

  srcbpl = HARD_CURSORWIDTH;
  dstbpl = displaywidth;
  op = 2; /* OR-in */
  new_bitblt_code;
#ifdef DISPLAYBUFFER
  flush_display_region(dx, newy, w, h);
#endif
}